

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O1

int __thiscall
ncnn::Deconvolution::forward(Deconvolution *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  float fVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  int *piVar7;
  size_t sVar8;
  void *pvVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  long lVar14;
  Deconvolution *pDVar15;
  Mat *pMVar16;
  pointer piVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  void *pvVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  ulong uVar26;
  void *pvVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  ulong uVar31;
  uint uVar32;
  undefined4 uVar33;
  float fVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  int iVar38;
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  int remain;
  vector<int,_std::allocator<int>_> _space_ofs;
  allocator_type local_181;
  Deconvolution *local_180;
  long local_178;
  void *local_170;
  Mat local_168;
  Mat *local_118;
  ulong local_110;
  ulong local_108;
  int local_100;
  int local_fc;
  float *local_f8;
  Option *local_f0;
  long local_e8;
  ulong local_e0;
  long local_d8;
  ulong local_d0;
  void *local_c8;
  ulong local_c0;
  Mat *local_b8;
  ulong local_b0;
  void *local_a8;
  long local_a0;
  void *local_98;
  ulong local_90;
  ulong local_88;
  long local_80;
  long local_78;
  long local_70;
  void *local_68;
  vector<int,_std::allocator<int>_> local_60;
  undefined1 local_48 [16];
  
  uVar19 = bottom_blob->w;
  local_b0 = (ulong)uVar19;
  uVar32 = bottom_blob->h;
  local_c0 = (ulong)uVar32;
  uVar3 = bottom_blob->c;
  iVar23 = this->kernel_w;
  iVar38 = this->dilation_w;
  sVar6 = bottom_blob->elemsize;
  iVar30 = this->stride_w;
  iVar4 = this->kernel_h;
  iVar5 = this->dilation_h;
  iVar22 = this->stride_h;
  iVar24 = this->output_pad_right;
  iVar25 = this->output_pad_bottom;
  local_168.cstep = 0;
  local_168.data = (void *)0x0;
  local_168.refcount._0_4_ = 0;
  local_168.refcount._4_4_ = 0;
  local_168.elemsize = 0;
  local_168.elempack = 0;
  local_168.allocator = (Allocator *)0x0;
  local_168.dims = 0;
  local_168.w = 0;
  local_168.h = 0;
  local_168.d = 0;
  local_168.c = 0;
  auVar35._0_4_ = -(uint)(0 < this->pad_left);
  auVar35._4_4_ = -(uint)(0 < this->pad_right);
  auVar35._8_4_ = -(uint)(0 < this->pad_top);
  auVar35._12_4_ = -(uint)(0 < this->pad_bottom);
  iVar18 = movmskps(uVar19,auVar35);
  lVar29 = 0x10;
  if ((iVar18 == 0) &&
     (((this->output_w < 1 || (this->output_h < 1)) && (lVar29 = 8, &local_168 != top_blob)))) {
    piVar7 = top_blob->refcount;
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + 1;
      UNLOCK();
    }
    lVar29 = 8;
    local_168.data = top_blob->data;
    local_168.refcount._0_4_ = SUB84(top_blob->refcount,0);
    local_168.refcount._4_4_ = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_168.elemsize = top_blob->elemsize;
    local_168.elempack = top_blob->elempack;
    local_168.allocator = top_blob->allocator;
    uVar10 = top_blob->dims;
    uVar11 = top_blob->w;
    uVar12 = top_blob->h;
    uVar13 = top_blob->d;
    local_168.c = top_blob->c;
    local_168.cstep = top_blob->cstep;
    local_168.dims = uVar10;
    local_168.w = uVar11;
    local_168.h = uVar12;
    local_168.d = uVar13;
  }
  iVar30 = iVar24 + (iVar23 + -1) * iVar38 + (uVar19 - 1) * iVar30 + 1;
  iVar23 = iVar25 + 1 + (iVar4 + -1) * iVar5 + (uVar32 - 1) * iVar22;
  local_180 = this;
  local_118 = top_blob;
  local_f0 = opt;
  local_b8 = bottom_blob;
  Mat::create(&local_168,iVar30,iVar23,this->num_output,sVar6,
              *(Allocator **)(&opt->lightmode + lVar29));
  pDVar15 = local_180;
  iVar38 = -100;
  if ((local_168.data != (void *)0x0) && ((long)local_168.c * local_168.cstep != 0)) {
    uVar19 = local_180->kernel_w * local_180->kernel_h;
    std::vector<int,_std::allocator<int>_>::vector(&local_60,(long)(int)uVar19,&local_181);
    piVar17 = local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start;
    if (0 < pDVar15->kernel_h) {
      iVar38 = pDVar15->dilation_h;
      iVar4 = pDVar15->dilation_w;
      iVar5 = pDVar15->kernel_w;
      iVar22 = 0;
      iVar24 = 0;
      iVar25 = 0;
      do {
        if (0 < pDVar15->kernel_w) {
          lVar29 = 0;
          do {
            local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[iVar22 + lVar29] = iVar24;
            iVar24 = iVar24 + pDVar15->dilation_w;
            lVar29 = lVar29 + 1;
          } while ((int)lVar29 < pDVar15->kernel_w);
          iVar22 = iVar22 + (int)lVar29;
        }
        iVar24 = iVar24 + (iVar38 * iVar30 - iVar4 * iVar5);
        iVar25 = iVar25 + 1;
      } while (iVar25 < pDVar15->kernel_h);
    }
    local_80 = (long)pDVar15->num_output;
    if (0 < local_80) {
      local_e8 = local_168.cstep * local_168.elemsize;
      local_d0 = (ulong)(uint)(iVar23 * iVar30);
      local_fc = local_180->bias_term;
      local_a8 = (local_180->bias_data).data;
      local_f8 = (float *)(local_180->activation_params).data;
      uVar32 = local_168.d * local_168.h * local_168.w;
      if (local_168.dims == 3) {
        uVar32 = local_168.h * local_168.w;
      }
      local_88 = (ulong)uVar32;
      local_90 = (ulong)(uVar32 + 3 & 0xfffffffc);
      lVar29 = local_88 - 1;
      auVar39._8_4_ = (int)lVar29;
      auVar39._0_8_ = lVar29;
      auVar39._12_4_ = (int)((ulong)lVar29 >> 0x20);
      local_a0 = local_168.elemsize * (long)local_168.w;
      lVar29 = (long)local_168.data + 0xc;
      local_100 = uVar3 * uVar19;
      local_110 = 0;
      auVar39 = auVar39 ^ _DAT_003190c0;
      local_e0 = (ulong)(local_180->activation_type - 1);
      local_98 = local_168.data;
      lVar28 = 0;
      pvVar27 = local_168.data;
      auVar35 = _DAT_003190a0;
      auVar40 = _DAT_003190b0;
      auVar41 = _DAT_003190c0;
      local_48 = auVar39;
      do {
        uVar33 = 0;
        if (local_fc != 0) {
          uVar33 = *(undefined4 *)((long)local_a8 + lVar28 * 4);
        }
        if (0 < (int)local_88) {
          uVar20 = 0;
          do {
            auVar36._8_4_ = (int)uVar20;
            auVar36._0_8_ = uVar20;
            auVar36._12_4_ = (int)(uVar20 >> 0x20);
            auVar37 = (auVar36 | auVar40) ^ auVar41;
            iVar23 = auVar39._4_4_;
            if ((bool)(~(iVar23 < auVar37._4_4_ ||
                        auVar39._0_4_ < auVar37._0_4_ && auVar37._4_4_ == iVar23) & 1)) {
              *(undefined4 *)(lVar29 + -0xc + uVar20 * 4) = uVar33;
            }
            if (auVar37._12_4_ <= auVar39._12_4_ &&
                (auVar37._8_4_ <= auVar39._8_4_ || auVar37._12_4_ != auVar39._12_4_)) {
              *(undefined4 *)(lVar29 + -8 + uVar20 * 4) = uVar33;
            }
            auVar36 = (auVar36 | auVar35) ^ auVar41;
            iVar38 = auVar36._4_4_;
            if (iVar38 <= iVar23 && (iVar38 != iVar23 || auVar36._0_4_ <= auVar39._0_4_)) {
              *(undefined4 *)(lVar29 + -4 + uVar20 * 4) = uVar33;
              *(undefined4 *)(lVar29 + uVar20 * 4) = uVar33;
            }
            uVar20 = uVar20 + 4;
          } while (local_90 != uVar20);
        }
        if (0 < (int)local_c0) {
          local_68 = (void *)(local_e8 * lVar28 + (long)local_98);
          local_70 = local_180->stride_h * local_a0;
          local_178 = (long)local_180->stride_w;
          local_170 = (void *)((long)(int)local_110 * 4 + (long)(local_180->weight_data).data);
          local_108 = 0;
          do {
            if (0 < (int)local_b0) {
              iVar23 = local_b8->w;
              uVar20 = 0;
              do {
                if (0 < (int)uVar3) {
                  sVar6 = local_b8->elemsize;
                  sVar8 = local_b8->cstep;
                  pvVar9 = local_b8->data;
                  lVar14 = uVar20 * local_178 * 4 + local_108 * local_70;
                  uVar26 = 0;
                  pvVar21 = local_170;
                  do {
                    if (0 < (int)uVar19) {
                      fVar34 = *(float *)((long)pvVar9 +
                                         sVar8 * sVar6 * uVar26 +
                                         uVar20 * 4 + sVar6 * (long)iVar23 * local_108);
                      uVar31 = 0;
                      do {
                        *(float *)((long)local_68 + (long)piVar17[uVar31] * 4 + lVar14) =
                             *(float *)((long)pvVar21 + uVar31 * 4) * fVar34 +
                             *(float *)((long)local_68 + (long)piVar17[uVar31] * 4 + lVar14);
                        uVar31 = uVar31 + 1;
                      } while (uVar19 != uVar31);
                    }
                    uVar26 = uVar26 + 1;
                    pvVar21 = (void *)((long)pvVar21 + (long)(int)uVar19 * 4);
                  } while (uVar26 != uVar3);
                }
                uVar20 = uVar20 + 1;
              } while (uVar20 != local_b0);
            }
            local_108 = local_108 + 1;
          } while (local_108 != local_c0);
        }
        local_d8 = lVar28;
        local_c8 = pvVar27;
        local_78 = lVar29;
        if ((uint)local_e0 < 4) {
          iVar23 = (int)local_d0;
          switch((long)&switchD_001cfdc9::switchdataD_0031bb64 +
                 (long)(int)(&switchD_001cfdc9::switchdataD_0031bb64)[local_e0]) {
          case 0x1cfdcb:
            if (0 < iVar23) {
              uVar20 = 0;
              do {
                fVar34 = *(float *)((long)pvVar27 + uVar20 * 4);
                if (fVar34 <= 0.0) {
                  fVar34 = 0.0;
                }
                *(float *)((long)pvVar27 + uVar20 * 4) = fVar34;
                uVar20 = uVar20 + 1;
              } while (local_d0 != uVar20);
            }
            break;
          case 0x1cfdf4:
            if (0 < iVar23) {
              fVar34 = *local_f8;
              fVar2 = local_f8[1];
              uVar20 = 0;
              do {
                pfVar1 = (float *)((long)pvVar27 + uVar20 * 4);
                if (*pfVar1 <= fVar34 && fVar34 != *pfVar1) {
                  *(float *)((long)pvVar27 + uVar20 * 4) = fVar34;
                }
                if (fVar2 < *(float *)((long)pvVar27 + uVar20 * 4)) {
                  *(float *)((long)pvVar27 + uVar20 * 4) = fVar2;
                }
                uVar20 = uVar20 + 1;
              } while (local_d0 != uVar20);
            }
            break;
          case 0x1cfe32:
            if (0 < iVar23) {
              uVar20 = 0;
              do {
                fVar34 = expf((float)(*(uint *)((long)local_c8 + uVar20 * 4) ^ auVar41._0_4_));
                auVar41 = _DAT_003190c0;
                auVar40 = _DAT_003190b0;
                auVar35 = _DAT_003190a0;
                *(float *)((long)local_c8 + uVar20 * 4) = 1.0 / (fVar34 + 1.0);
                uVar20 = uVar20 + 1;
                auVar39 = local_48;
              } while (local_d0 != uVar20);
            }
            break;
          case 0x1cfea4:
            if (0 < iVar23) {
              fVar34 = *local_f8;
              uVar20 = 0;
              do {
                fVar2 = *(float *)((long)pvVar27 + uVar20 * 4);
                uVar32 = -(uint)(0.0 < fVar2);
                *(float *)((long)pvVar27 + uVar20 * 4) =
                     (float)(~uVar32 & (uint)fVar34 | uVar32 & 0x3f800000) * fVar2;
                uVar20 = uVar20 + 1;
              } while (local_d0 != uVar20);
            }
          }
        }
        lVar28 = local_d8 + 1;
        lVar29 = local_78 + local_e8;
        local_110 = (ulong)(uint)((int)local_110 + local_100);
        pvVar27 = (void *)((long)local_c8 + local_e8);
      } while (lVar28 != local_80);
    }
    pMVar16 = local_118;
    cut_padding(local_180,&local_168,local_118,local_f0);
    if (pMVar16->data == (void *)0x0) {
      iVar38 = -100;
    }
    else {
      iVar38 = -100;
      if ((long)pMVar16->c * pMVar16->cstep != 0) {
        iVar38 = 0;
      }
    }
    if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  piVar7 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_168.allocator == (Allocator *)0x0) {
        if (local_168.data != (void *)0x0) {
          free(local_168.data);
        }
      }
      else {
        (*(local_168.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar38;
}

Assistant:

int Deconvolution::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // backward strided convolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = outw * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        Mat out = top_blob_bordered.channel(p);

        const float bias = bias_term ? bias_data[p] : 0.f;

        out.fill(bias);

        for (int i = 0; i < h; i++)
        {
            for (int j = 0; j < w; j++)
            {
                float* outptr = out.row(i * stride_h) + j * stride_w;

                const float* kptr = (const float*)weight_data + maxk * channels * p;

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    float val = *(m.row(i) + j);

                    for (int k = 0; k < maxk; k++)
                    {
                        float w = kptr[k];
                        outptr[space_ofs[k]] += val * w;
                    }

                    kptr += maxk;
                }
            }
        }

        if (activation_type == 1)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = std::max(outptr[i], 0.f);
            }
        }
        else if (activation_type == 2)
        {
            float* outptr = out;
            int size = outw * outh;
            float slope = activation_params[0];

            for (int i = 0; i < size; i++)
            {
                outptr[i] = outptr[i] > 0.f ? outptr[i] : outptr[i] * slope;
            }
        }
        else if (activation_type == 3)
        {
            float* outptr = out;
            int size = outw * outh;
            float min = activation_params[0];
            float max = activation_params[1];

            for (int i = 0; i < size; i++)
            {
                if (outptr[i] < min)
                    outptr[i] = min;
                if (outptr[i] > max)
                    outptr[i] = max;
            }
        }
        else if (activation_type == 4)
        {
            float* outptr = out;
            int size = outw * outh;

            for (int i = 0; i < size; i++)
            {
                outptr[i] = static_cast<float>(1.f / (1.f + exp(-outptr[i])));
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}